

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O0

bool __thiscall
jsonnet::Jsonnet::evaluateSnippet(Jsonnet *this,string *filename,string *snippet,string *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *in_RCX;
  undefined8 *in_RDI;
  char *jsonnet_output;
  int error;
  int local_2c;
  char *local_28;
  bool local_1;
  
  if (in_RCX == (char *)0x0) {
    local_1 = false;
  }
  else {
    local_2c = 0;
    uVar3 = *in_RDI;
    local_28 = in_RCX;
    uVar1 = std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = jsonnet_evaluate_snippet(uVar3,uVar1,uVar2,&local_2c);
    if (local_2c == 0) {
      std::__cxx11::string::assign(local_28);
      jsonnet_realloc(*in_RDI,uVar3,0);
      local_1 = true;
    }
    else {
      std::__cxx11::string::assign((char *)(in_RDI + 1));
      jsonnet_realloc(*in_RDI,uVar3,0);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Jsonnet::evaluateSnippet(const std::string& filename, const std::string& snippet,
                              std::string* output)
{
    if (output == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output =
        ::jsonnet_evaluate_snippet(vm_, filename.c_str(), snippet.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    output->assign(jsonnet_output);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}